

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

void __thiscall
QObjectPrivate::setThreadData_helper
          (QObjectPrivate *this,QThreadData *currentData,QThreadData *targetData,
          QBindingStatus *status)

{
  QObject *pQVar1;
  __pointer_type pCVar2;
  AtomicType this_00;
  Sender *pSVar3;
  long lVar4;
  Connection *pCVar5;
  ulong uVar6;
  QPostEvent *pQVar7;
  long lVar8;
  ulong uVar9;
  
  if (status != (QBindingStatus *)0x0) {
    (this->super_QObjectData).bindingStorage.bindingStatus = status;
  }
  uVar6 = (currentData->postEventList).super_QList<QPostEvent>.d.size;
  if (uVar6 != 0) {
    pQVar1 = (this->super_QObjectData).q_ptr;
    lVar8 = 0;
    lVar4 = 0;
    uVar9 = 0;
    do {
      pQVar7 = (currentData->postEventList).super_QList<QPostEvent>.d.ptr;
      if ((*(long *)((long)&pQVar7->event + lVar8) != 0) &&
         (*(QObject **)((long)&pQVar7->receiver + lVar8) == pQVar1)) {
        pQVar7 = (QPostEvent *)((long)&pQVar7->receiver + lVar8);
        QPostEventList::addEvent(&targetData->postEventList,pQVar7);
        pQVar7->event = (QEvent *)0x0;
        lVar4 = lVar4 + 1;
        uVar6 = (currentData->postEventList).super_QList<QPostEvent>.d.size;
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x18;
    } while (uVar9 < uVar6);
    if ((0 < lVar4) &&
       ((targetData->eventDispatcher).super_QBasicAtomicPointer<QAbstractEventDispatcher>._q_value.
        _M_b._M_p != (__pointer_type)0x0)) {
      targetData->canWait = false;
      (*(((targetData->eventDispatcher).super_QBasicAtomicPointer<QAbstractEventDispatcher>._q_value
          ._M_b._M_p)->super_QObject)._vptr_QObject[0x14])();
    }
  }
  pCVar2 = (this->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>._q_value.
           _M_b._M_p;
  if (pCVar2 != (__pointer_type)0x0) {
    pSVar3 = pCVar2->currentSender;
    if (pSVar3 != (Sender *)0x0) {
      do {
        pSVar3->receiver = (QObject *)0x0;
        pSVar3 = pSVar3->previous;
      } while (pSVar3 != (Sender *)0x0);
      pCVar2->currentSender = (Sender *)0x0;
    }
    for (pCVar5 = pCVar2->senders; pCVar5 != (Connection *)0x0;
        pCVar5 = (pCVar5->super_ConnectionOrSignalVector).field_0.next) {
      if ((__pointer_type)(pCVar5->receiver).super_QBasicAtomicPointer<QObject>._q_value._M_b !=
          (__pointer_type)0x0) {
        LOCK();
        (targetData->_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (targetData->_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
        this_00._M_b._M_p =
             (pCVar5->receiverThreadData).super_QBasicAtomicPointer<QThreadData>._q_value._M_b;
        if (this_00._M_b._M_p != (__pointer_type)0x0) {
          QThreadData::deref((QThreadData *)this_00._M_b._M_p);
        }
        (pCVar5->receiverThreadData).super_QBasicAtomicPointer<QThreadData>._q_value._M_b =
             (__base_type)targetData;
      }
    }
  }
  LOCK();
  (targetData->_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (targetData->_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  QThreadData::deref((this->threadData).super_QBasicAtomicPointer<QThreadData>._q_value._M_b._M_p);
  (this->threadData).super_QBasicAtomicPointer<QThreadData>._q_value._M_b._M_p = targetData;
  if ((this->super_QObjectData).children.d.size != 0) {
    uVar6 = 0;
    do {
      setThreadData_helper
                ((QObjectPrivate *)((this->super_QObjectData).children.d.ptr[uVar6]->d_ptr).d,
                 currentData,targetData,status);
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)(this->super_QObjectData).children.d.size);
  }
  return;
}

Assistant:

void QObjectPrivate::setThreadData_helper(QThreadData *currentData, QThreadData *targetData, QBindingStatus *status)
{
    Q_Q(QObject);

    if (status) {
        // the new thread is already running
        this->bindingStorage.bindingStatus = status;
    }

    // move posted events
    qsizetype eventsMoved = 0;
    for (qsizetype i = 0; i < currentData->postEventList.size(); ++i) {
        const QPostEvent &pe = currentData->postEventList.at(i);
        if (!pe.event)
            continue;
        if (pe.receiver == q) {
            // move this post event to the targetList
            targetData->postEventList.addEvent(pe);
            const_cast<QPostEvent &>(pe).event = nullptr;
            ++eventsMoved;
        }
    }
    if (eventsMoved > 0 && targetData->hasEventDispatcher()) {
        targetData->canWait = false;
        targetData->eventDispatcher.loadRelaxed()->wakeUp();
    }

    // the current emitting thread shouldn't restore currentSender after calling moveToThread()
    ConnectionData *cd = connections.loadAcquire();
    if (cd) {
        if (cd->currentSender) {
            cd->currentSender->receiverDeleted();
            cd->currentSender = nullptr;
        }

        // adjust the receiverThreadId values in the Connections
        if (cd) {
            auto *c = cd->senders;
            while (c) {
                QObject *r = c->receiver.loadRelaxed();
                if (r) {
                    Q_ASSERT(r == q);
                    targetData->ref();
                    QThreadData *old = c->receiverThreadData.loadRelaxed();
                    if (old)
                        old->deref();
                    c->receiverThreadData.storeRelaxed(targetData);
                }
                c = c->next;
            }
        }

    }

    // set new thread data
    targetData->ref();
    threadData.loadRelaxed()->deref();

    // synchronizes with loadAcquire e.g. in QCoreApplication::postEvent
    threadData.storeRelease(targetData);

    for (int i = 0; i < children.size(); ++i) {
        QObject *child = children.at(i);
        child->d_func()->setThreadData_helper(currentData, targetData, status);
    }
}